

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

EC_KEY * ecdh_gerenate_key(EC_GROUP *group)

{
  int iVar1;
  EC_GROUP *in_RDI;
  EC_KEY *key;
  EC_KEY *local_8;
  
  local_8 = EC_KEY_new();
  if (local_8 == (EC_KEY *)0x0) {
    local_8 = (EC_KEY *)0x0;
  }
  else {
    iVar1 = EC_KEY_set_group(local_8,in_RDI);
    if ((iVar1 == 0) || (iVar1 = EC_KEY_generate_key(local_8), iVar1 == 0)) {
      EC_KEY_free(local_8);
      local_8 = (EC_KEY *)0x0;
    }
  }
  return (EC_KEY *)local_8;
}

Assistant:

static EC_KEY *ecdh_gerenate_key(EC_GROUP *group)
{
    EC_KEY *key;

    if ((key = EC_KEY_new()) == NULL)
        return NULL;
    if (!EC_KEY_set_group(key, group) || !EC_KEY_generate_key(key)) {
        EC_KEY_free(key);
        return NULL;
    }

    return key;
}